

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O3

bool Assimp::Q3Shader::LoadShader(ShaderData *fill,string *pFile,IOSystem *io)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  BlendFunc BVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  Logger *pLVar7;
  long lVar8;
  _List_node_base *p_Var9;
  ulong uVar10;
  _List_node_base *p_Var11;
  byte *pbVar12;
  byte *__s2;
  vector<char,_std::allocator<char>_> _buff;
  string at;
  _List_node_base *local_208;
  string local_1f8;
  ShaderData *local_1d8;
  vector<char,_std::allocator<char>_> local_1d0;
  _List_node_base **local_1b8;
  _List_node_base *local_1b0;
  undefined1 local_1a8 [8];
  _List_node_base *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _List_node_base *local_188;
  _List_node_base local_180;
  size_t local_170;
  ios_base local_138 [264];
  long *plVar6;
  
  local_1a8 = (undefined1  [8])&local_198;
  local_1d8 = fill;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rt","");
  iVar3 = (*io->_vptr_IOSystem[4])(io,(pFile->_M_dataplus)._M_p,local_1a8);
  plVar6 = (long *)CONCAT44(extraout_var,iVar3);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  if (plVar6 != (long *)0x0) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[28]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [28])"Loading Quake3 shader file ");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pFile->_M_dataplus)._M_p,pFile->_M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar7,local_1f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar8 = (**(code **)(*plVar6 + 0x30))(plVar6);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_1d0,lVar8 + 1,(allocator_type *)local_1a8);
    (**(code **)(*plVar6 + 0x10))
              (plVar6,local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,lVar8,1);
    local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = 0;
    CommentRemover::RemoveLineComments
              ("//",local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,' ');
    local_208 = (_List_node_base *)0x0;
    pbVar12 = (byte *)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      while( true ) {
        uVar10 = (ulong)*pbVar12;
        if (0x20 < uVar10) break;
        if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
          if (uVar10 == 0) goto LAB_003ebc72;
          break;
        }
        pbVar12 = pbVar12 + 1;
      }
      if (*pbVar12 == 0x7b) goto code_r0x003eb53f;
      local_1a0 = (_List_node_base *)0x0;
      local_198._M_local_buf[0] = '\0';
      local_188 = (_List_node_base *)CONCAT44(local_188._4_4_,1);
      local_170 = 0;
      local_1a8 = (undefined1  [8])&local_198;
      local_180._M_next = &local_180;
      local_180._M_prev = &local_180;
      std::__cxx11::
      list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>::
      _M_insert<Assimp::Q3Shader::ShaderDataBlock>
                (&local_1d8->blocks,(iterator)local_1d8,(ShaderDataBlock *)local_1a8);
      std::__cxx11::
      _List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
      ::_M_clear((_List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                  *)&local_180);
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
      while ((uVar10 = (ulong)*pbVar12, uVar10 < 0x21 &&
             ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0))) {
        pbVar12 = pbVar12 + 1;
      }
      local_208 = (local_1d8->blocks).
                  super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1;
      __s2 = pbVar12;
      while ((0x20 < (byte)uVar10 || ((0x100003601U >> (uVar10 & 0x3f) & 1) == 0))) {
        pbVar1 = __s2 + 1;
        __s2 = __s2 + 1;
        uVar10 = (ulong)*pbVar1;
      }
      local_1a8 = (undefined1  [8])&local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar12,__s2);
      std::__cxx11::string::operator=((string *)local_208,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
LAB_003ebc36:
      while( true ) {
        bVar2 = *__s2;
        if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
        __s2 = __s2 + 1;
      }
      while ((bVar2 == 0xd || (pbVar12 = __s2, bVar2 == 10))) {
        pbVar12 = __s2 + 1;
        __s2 = __s2 + 1;
        bVar2 = *pbVar12;
      }
    } while( true );
  }
LAB_003ebc97:
  return plVar6 != (long *)0x0;
code_r0x003eb53f:
  if (local_208 != (_List_node_base *)0x0) {
    __s2 = pbVar12 + 1;
    local_1b8 = &local_208[2]._M_prev;
LAB_003eb55c:
    bVar2 = *__s2;
    uVar10 = (ulong)bVar2;
    if (uVar10 < 0x21) {
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0) goto code_r0x003eb56c;
      if (uVar10 != 0) goto LAB_003eb57a;
    }
    else {
LAB_003eb57a:
      if (bVar2 == 0x7b) {
        local_1a0 = (_List_node_base *)0x0;
        local_198._M_local_buf[0] = '\0';
        local_188 = (_List_node_base *)0x0;
        local_180._M_next = (_List_node_base *)((ulong)local_180._M_next & 0xffffffff00000000);
        local_1a8 = (undefined1  [8])&local_198;
        p_Var9 = (_List_node_base *)operator_new(0x40);
        p_Var9[1]._M_next = p_Var9 + 2;
        if (local_1a8 == (undefined1  [8])&local_198) {
          p_Var9[2]._M_next =
               (_List_node_base *)
               CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]);
          p_Var9[2]._M_prev = (_List_node_base *)local_198._8_8_;
        }
        else {
          p_Var9[1]._M_next = (_List_node_base *)local_1a8;
          p_Var9[2]._M_next =
               (_List_node_base *)
               CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]);
        }
        p_Var9[1]._M_prev = local_1a0;
        local_1a0 = (_List_node_base *)0x0;
        local_198._M_local_buf[0] = '\0';
        *(undefined4 *)&p_Var9[3]._M_prev = local_180._M_next._0_4_;
        p_Var9[3]._M_next = local_188;
        local_1a8 = (undefined1  [8])&local_198;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        local_208[3]._M_prev = (_List_node_base *)((long)&(local_208[3]._M_prev)->_M_next + 1);
        if (local_1a8 != (undefined1  [8])&local_198) {
          operator_delete((void *)local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        __s2 = __s2 + 1;
        p_Var9 = local_208[3]._M_next;
        local_1b0 = p_Var9 + 1;
LAB_003eb6b5:
        while( true ) {
          bVar2 = *__s2;
          uVar10 = (ulong)bVar2;
          if (0x20 < uVar10) break;
          if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
            if (uVar10 != 0) break;
            goto LAB_003ebb13;
          }
          __s2 = __s2 + 1;
        }
        iVar3 = strncasecmp("map",(char *)__s2,3);
        if ((((iVar3 == 0) && ((ulong)__s2[3] < 0x21)) &&
            (lVar8 = 4, (0x100003601U >> ((ulong)__s2[3] & 0x3f) & 1) != 0)) ||
           (((iVar3 = strncasecmp("clampmap",(char *)__s2,8), iVar3 == 0 && ((ulong)__s2[8] < 0x21))
            && (lVar8 = 9, (0x100003601U >> ((ulong)__s2[8] & 0x3f) & 1) != 0)))) {
          pbVar12 = __s2 + lVar8;
          local_1a8 = (undefined1  [8])&local_198;
          while ((uVar10 = (ulong)*pbVar12, __s2 = pbVar12, uVar10 < 0x21 &&
                 ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0))) {
            pbVar12 = pbVar12 + 1;
          }
          while ((0x20 < (byte)uVar10 || ((0x100003601U >> (uVar10 & 0x3f) & 1) == 0))) {
            uVar10 = (ulong)__s2[1];
            __s2 = __s2 + 1;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar12,__s2);
          std::__cxx11::string::operator=((string *)local_1b0,(string *)local_1a8);
LAB_003eb7d5:
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8,
                            CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]
                                    ) + 1);
          }
        }
        else {
          iVar3 = strncasecmp("blendfunc",(char *)__s2,9);
          if (((iVar3 == 0) && ((ulong)__s2[9] < 0x21)) &&
             ((0x100003601U >> ((ulong)__s2[9] & 0x3f) & 1) != 0)) {
            pbVar12 = __s2 + 10;
            local_1a8 = (undefined1  [8])&local_198;
            while ((uVar10 = (ulong)*pbVar12, __s2 = pbVar12, uVar10 < 0x21 &&
                   ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0))) {
              pbVar12 = pbVar12 + 1;
            }
            while ((0x20 < (byte)uVar10 || ((0x100003601U >> (uVar10 & 0x3f) & 1) == 0))) {
              uVar10 = (ulong)__s2[1];
              __s2 = __s2 + 1;
            }
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar12,__s2);
            iVar3 = std::__cxx11::string::compare((char *)local_1a8);
            if (iVar3 == 0) {
              p_Var11 = (_List_node_base *)0x100000001;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_1a8);
              if (iVar3 == 0) {
                p_Var11 = (_List_node_base *)0x200000003;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                if (iVar3 != 0) {
                  BVar4 = StringToBlendFunc((string *)local_1a8);
                  *(BlendFunc *)&p_Var9[3]._M_next = BVar4;
                  while ((uVar10 = (ulong)*__s2, pbVar12 = __s2, uVar10 < 0x21 &&
                         ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0))) {
                    __s2 = __s2 + 1;
                  }
                  while ((0x20 < (byte)uVar10 || ((0x100003601U >> (uVar10 & 0x3f) & 1) == 0))) {
                    uVar10 = (ulong)pbVar12[1];
                    pbVar12 = pbVar12 + 1;
                  }
                  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,__s2,pbVar12)
                  ;
                  BVar4 = StringToBlendFunc(&local_1f8);
                  *(BlendFunc *)((long)&p_Var9[3]._M_next + 4) = BVar4;
                  __s2 = pbVar12;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_003eb7d5;
                }
                p_Var11 = (_List_node_base *)0x600000005;
              }
            }
            p_Var9[3]._M_next = p_Var11;
            goto LAB_003eb7d5;
          }
          iVar3 = strncasecmp("alphafunc",(char *)__s2,9);
          if (((iVar3 == 0) && ((ulong)__s2[9] < 0x21)) &&
             ((0x100003601U >> ((ulong)__s2[9] & 0x3f) & 1) != 0)) {
            pbVar12 = __s2 + 10;
            local_1a8 = (undefined1  [8])&local_198;
            while ((uVar10 = (ulong)*pbVar12, __s2 = pbVar12, uVar10 < 0x21 &&
                   ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0))) {
              pbVar12 = pbVar12 + 1;
            }
            while ((0x20 < (byte)uVar10 || ((0x100003601U >> (uVar10 & 0x3f) & 1) == 0))) {
              uVar10 = (ulong)__s2[1];
              __s2 = __s2 + 1;
            }
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar12,__s2);
            iVar3 = std::__cxx11::string::compare((char *)local_1a8);
            if (iVar3 == 0) {
              uVar5 = 1;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_1a8);
              if (iVar3 == 0) {
                uVar5 = 2;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_1a8);
                if (iVar3 != 0) goto LAB_003eb7d5;
                uVar5 = 3;
              }
            }
            *(undefined4 *)&p_Var9[3]._M_prev = uVar5;
            goto LAB_003eb7d5;
          }
          if (bVar2 == 0x7d) goto LAB_003ebad9;
        }
        while( true ) {
          bVar2 = *__s2;
          if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
          __s2 = __s2 + 1;
        }
        while ((bVar2 == 0xd || (bVar2 == 10))) {
          pbVar12 = __s2 + 1;
          __s2 = __s2 + 1;
          bVar2 = *pbVar12;
        }
        goto LAB_003eb6b5;
      }
      if (bVar2 != 0x7d) {
        iVar3 = strncasecmp("cull",(char *)__s2,4);
        if (((iVar3 == 0) && ((ulong)__s2[4] < 0x21)) &&
           ((0x100003601U >> ((ulong)__s2[4] & 0x3f) & 1) != 0)) {
          for (__s2 = __s2 + 5; (*__s2 == 0x20 || (*__s2 == 9)); __s2 = __s2 + 1) {
          }
          iVar3 = strncasecmp((char *)__s2,"back",4);
          if (iVar3 == 0) {
            *(undefined4 *)&local_208[2]._M_next = 2;
          }
          else {
            iVar3 = strncasecmp((char *)__s2,"front",5);
            if (iVar3 == 0) {
              *(undefined4 *)&local_208[2]._M_next = 1;
            }
            else {
              iVar3 = strncasecmp((char *)__s2,"none",4);
              if ((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s2,"disable",7), iVar3 == 0)) {
                *(undefined4 *)&local_208[2]._M_next = 0;
              }
              else {
                pLVar7 = DefaultLogger::get();
                Logger::error(pLVar7,"Q3Shader: Unrecognized cull mode");
              }
            }
          }
        }
        goto LAB_003ebb13;
      }
      __s2 = __s2 + 1;
      local_208 = (_List_node_base *)0x0;
    }
    goto LAB_003ebc36;
  }
  pLVar7 = DefaultLogger::get();
  Logger::error(pLVar7,"Q3Shader: Unexpected shader section token \'{\'");
LAB_003ebc72:
  if ((byte *)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (**(code **)(*plVar6 + 8))(plVar6);
  goto LAB_003ebc97;
code_r0x003eb56c:
  __s2 = __s2 + 1;
  goto LAB_003eb55c;
LAB_003ebad9:
  __s2 = __s2 + 1;
LAB_003ebb13:
  while( true ) {
    bVar2 = *__s2;
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
    __s2 = __s2 + 1;
  }
  while ((bVar2 == 0xd || (bVar2 == 10))) {
    pbVar12 = __s2 + 1;
    __s2 = __s2 + 1;
    bVar2 = *pbVar12;
  }
  goto LAB_003eb55c;
}

Assistant:

bool Q3Shader::LoadShader(ShaderData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO_F("Loading Quake3 shader file ", pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove comments from it (C++ style)
    CommentRemover::RemoveLineComments("//",&_buff[0]);
    const char* buff = &_buff[0];

    Q3Shader::ShaderDataBlock* curData = NULL;
    Q3Shader::ShaderMapBlock*  curMap  = NULL;

    // read line per line
    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {

        if (*buff == '{') {
            ++buff;

            // append to last section, if any
            if (!curData) {
                ASSIMP_LOG_ERROR("Q3Shader: Unexpected shader section token \'{\'");
                return true; // still no failure, the file is there
            }

            // read this data section
            for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                if (*buff == '{') {
                    ++buff;
                    // add new map section
                    curData->maps.push_back(Q3Shader::ShaderMapBlock());
                    curMap = &curData->maps.back();

                    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                        // 'map' - Specifies texture file name
                        if (TokenMatchI(buff,"map",3) || TokenMatchI(buff,"clampmap",8)) {
                            curMap->name = GetNextToken(buff);
                        }
                        // 'blendfunc' - Alpha blending mode
                        else if (TokenMatchI(buff,"blendfunc",9)) {
                            const std::string blend_src = GetNextToken(buff);
                            if (blend_src == "add") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_ONE;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE;
                            }
                            else if (blend_src == "filter") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_DST_COLOR;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ZERO;
                            }
                            else if (blend_src == "blend") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_SRC_ALPHA;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE_MINUS_SRC_ALPHA;
                            }
                            else {
                                curMap->blend_src  = StringToBlendFunc(blend_src);
                                curMap->blend_dest = StringToBlendFunc(GetNextToken(buff));
                            }
                        }
                        // 'alphafunc' - Alpha testing mode
                        else if (TokenMatchI(buff,"alphafunc",9)) {
                            const std::string at = GetNextToken(buff);
                            if (at == "GT0") {
                                curMap->alpha_test = Q3Shader::AT_GT0;
                            }
                            else if (at == "LT128") {
                                curMap->alpha_test = Q3Shader::AT_LT128;
                            }
                            else if (at == "GE128") {
                                curMap->alpha_test = Q3Shader::AT_GE128;
                            }
                        }
                        else if (*buff == '}') {
                            ++buff;
                            // close this map section
                            curMap = NULL;
                            break;
                        }
                    }

                }
                else if (*buff == '}') {
                    ++buff;
                    curData = NULL;
                    break;
                }

                // 'cull' specifies culling behaviour for the model
                else if (TokenMatchI(buff,"cull",4)) {
                    SkipSpaces(&buff);
                    if (!ASSIMP_strincmp(buff,"back",4)) {
                        curData->cull = Q3Shader::CULL_CCW;
                    } else if (!ASSIMP_strincmp(buff,"front",5)) {
                        curData->cull = Q3Shader::CULL_CW;
                    } else if (!ASSIMP_strincmp(buff,"none",4) || !ASSIMP_strincmp(buff,"disable",7)) {
                        curData->cull = Q3Shader::CULL_NONE;
                    } else {
                        ASSIMP_LOG_ERROR("Q3Shader: Unrecognized cull mode");
                    }
                }
            }
        } else {
            // add new section
            fill.blocks.push_back(Q3Shader::ShaderDataBlock());
            curData = &fill.blocks.back();

            // get the name of this section
            curData->name = GetNextToken(buff);
        }
    }
    return true;
}